

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

char * file_base(char *path)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  char *pcVar4;
  
  sVar3 = strlen(path);
  if (path + (sVar3 - 1) < path) {
    pcVar4 = (char *)0x0;
  }
  else {
    do {
      if (sVar3 == 1) {
        return path;
      }
      sVar1 = sVar3 - 1;
      lVar2 = sVar3 - 2;
      sVar3 = sVar1;
    } while (path[lVar2] != '/');
    pcVar4 = path + sVar1;
  }
  return pcVar4;
}

Assistant:

const char *file_base(const char *path)
{
  const char *src = path + strlen(path) - 1;
  if( src >= path ){
    // back up until a / or the start
    while (src != path && !is_seperator(*(src - 1)))
      src--;

    // Check for files with drive specification but no path
#if defined(_WIN32) || defined(DOS)
    if( src == path && src[0] != 0 ){
      if( src[1] == ':' )
        src += 2;
    }
#endif
    return src;
  }
  return NULL;
}